

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.cc
# Opt level: O1

void DES_ncbc_encrypt_ex(uint8_t *in,uint8_t *out,size_t len,DES_key_schedule *schedule,
                        uint8_t *ivec,int enc)

{
  byte *pbVar1;
  DES_key_schedule *pDVar2;
  uint8_t *puVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint32_t tin [2];
  uint local_50;
  uint local_4c;
  DES_key_schedule *local_48;
  uint local_3c;
  uint8_t *local_38;
  
  uVar4 = *(uint *)ivec;
  local_3c = *(uint *)(ivec + 4);
  if (enc == 0) {
    uVar5 = uVar4;
    uVar6 = local_3c;
    pDVar2 = (DES_key_schedule *)schedule;
    puVar3 = ivec;
    if (7 < len) {
      do {
        local_38 = puVar3;
        local_48 = pDVar2;
        uVar4 = *(uint *)in;
        local_4c = *(uint *)((long)in + 4);
        in = (uint8_t *)((long)in + 8);
        local_50 = uVar4;
        local_3c = local_4c;
        DES_encrypt1(&local_50,local_48,0);
        uVar5 = uVar5 ^ local_50;
        uVar6 = uVar6 ^ local_4c;
        *out = (uint8_t)uVar5;
        out[1] = (uint8_t)(uVar5 >> 8);
        out[2] = (uint8_t)(uVar5 >> 0x10);
        out[3] = (uint8_t)(uVar5 >> 0x18);
        out[4] = (uint8_t)uVar6;
        out[5] = (uint8_t)(uVar6 >> 8);
        out[6] = (uint8_t)(uVar6 >> 0x10);
        out[7] = (uint8_t)(uVar6 >> 0x18);
        out = out + 8;
        len = len - 8;
        ivec = local_38;
        schedule = (DES_key_schedule *)local_48;
        uVar5 = uVar4;
        uVar6 = local_3c;
        pDVar2 = local_48;
        puVar3 = local_38;
      } while (7 < len);
    }
    local_4c = local_3c;
    if (len != 0) {
      local_50 = *(uint *)in;
      local_4c = *(uint *)((long)in + 4);
      local_48 = (DES_key_schedule *)CONCAT44(local_48._4_4_,local_4c);
      local_3c = local_50;
      DES_encrypt1(&local_50,(DES_key_schedule *)schedule,0);
      (*(code *)(&DAT_0028c82c + *(int *)(&DAT_0028c82c + (len - 1) * 4)))();
      return;
    }
    goto LAB_002135f8;
  }
  local_50 = uVar4;
  if (7 < len) {
    do {
      local_50 = local_50 ^ *(uint *)in;
      local_4c = local_3c ^ *(uint *)((long)in + 4);
      in = (uint8_t *)((long)in + 8);
      DES_encrypt1(&local_50,(DES_key_schedule *)schedule,1);
      *(uint *)out = local_50;
      *(uint *)((long)out + 4) = local_4c;
      out = (uint8_t *)((long)out + 8);
      len = len - 8;
      local_3c = local_4c;
    } while (7 < len);
  }
  uVar4 = local_50;
  local_4c = local_3c;
  if (len == 0) goto LAB_002135f8;
  lVar7 = (long)in + len;
  uVar4 = 0;
  switch(len) {
  case 1:
    local_4c = 0;
    goto LAB_00213569;
  case 2:
    local_4c = 0;
    goto LAB_0021355c;
  case 3:
    local_4c = 0;
    uVar5 = uVar4;
    break;
  case 7:
    pbVar1 = (byte *)(lVar7 + -1);
    lVar7 = lVar7 + -1;
    uVar4 = (uint)*pbVar1 << 0x10;
  case 6:
    pbVar1 = (byte *)(lVar7 + -1);
    lVar7 = lVar7 + -1;
    uVar4 = uVar4 | (uint)*pbVar1 << 8;
  case 5:
    pbVar1 = (byte *)(lVar7 + -1);
    lVar7 = lVar7 + -1;
    uVar4 = uVar4 | *pbVar1;
  case 4:
    pbVar1 = (byte *)(lVar7 + -1);
    lVar7 = lVar7 + -1;
    uVar5 = (uint)*pbVar1 << 0x18;
    local_4c = uVar4;
  }
  pbVar1 = (byte *)(lVar7 + -1);
  lVar7 = lVar7 + -1;
  uVar4 = uVar5 | (uint)*pbVar1 << 0x10;
LAB_0021355c:
  pbVar1 = (byte *)(lVar7 + -1);
  lVar7 = lVar7 + -1;
  uVar4 = uVar4 | (uint)*pbVar1 << 8;
LAB_00213569:
  local_50 = (*(byte *)(lVar7 + -1) | uVar4) ^ local_50;
  local_4c = local_4c ^ local_3c;
  DES_encrypt1(&local_50,(DES_key_schedule *)schedule,1);
  *(uint *)out = local_50;
  *(uint *)((long)out + 4) = local_4c;
  uVar4 = local_50;
LAB_002135f8:
  *ivec = (uint8_t)uVar4;
  ivec[1] = (uint8_t)(uVar4 >> 8);
  ivec[2] = (uint8_t)(uVar4 >> 0x10);
  ivec[3] = (uint8_t)(uVar4 >> 0x18);
  ivec[4] = (uint8_t)local_4c;
  ivec[5] = (uint8_t)(local_4c >> 8);
  ivec[6] = (uint8_t)(local_4c >> 0x10);
  ivec[7] = (uint8_t)(local_4c >> 0x18);
  return;
}

Assistant:

void DES_ncbc_encrypt_ex(const uint8_t *in, uint8_t *out, size_t len,
                         const DES_key_schedule *schedule, uint8_t ivec[8],
                         int enc) {
  uint32_t tin0, tin1;
  uint32_t tout0, tout1, xor0, xor1;
  uint32_t tin[2];
  unsigned char *iv;

  iv = ivec;

  if (enc) {
    c2l(iv, tout0);
    c2l(iv, tout1);
    for (; len >= 8; len -= 8) {
      c2l(in, tin0);
      c2l(in, tin1);
      tin0 ^= tout0;
      tin[0] = tin0;
      tin1 ^= tout1;
      tin[1] = tin1;
      DES_encrypt1(tin, schedule, DES_ENCRYPT);
      tout0 = tin[0];
      l2c(tout0, out);
      tout1 = tin[1];
      l2c(tout1, out);
    }
    if (len != 0) {
      c2ln(in, tin0, tin1, len);
      tin0 ^= tout0;
      tin[0] = tin0;
      tin1 ^= tout1;
      tin[1] = tin1;
      DES_encrypt1(tin, schedule, DES_ENCRYPT);
      tout0 = tin[0];
      l2c(tout0, out);
      tout1 = tin[1];
      l2c(tout1, out);
    }
    iv = ivec;
    l2c(tout0, iv);
    l2c(tout1, iv);
  } else {
    c2l(iv, xor0);
    c2l(iv, xor1);
    for (; len >= 8; len -= 8) {
      c2l(in, tin0);
      tin[0] = tin0;
      c2l(in, tin1);
      tin[1] = tin1;
      DES_encrypt1(tin, schedule, DES_DECRYPT);
      tout0 = tin[0] ^ xor0;
      tout1 = tin[1] ^ xor1;
      l2c(tout0, out);
      l2c(tout1, out);
      xor0 = tin0;
      xor1 = tin1;
    }
    if (len != 0) {
      c2l(in, tin0);
      tin[0] = tin0;
      c2l(in, tin1);
      tin[1] = tin1;
      DES_encrypt1(tin, schedule, DES_DECRYPT);
      tout0 = tin[0] ^ xor0;
      tout1 = tin[1] ^ xor1;
      l2cn(tout0, tout1, out, len);
      xor0 = tin0;
      xor1 = tin1;
    }
    iv = ivec;
    l2c(xor0, iv);
    l2c(xor1, iv);
  }
  tin[0] = tin[1] = 0;
}